

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_create(REF_INTERP *ref_interp_ptr,REF_GRID from_grid,REF_GRID to_grid)

{
  size_t __size;
  REF_MPI ref_mpi;
  uint uVar1;
  REF_BOOL RVar2;
  uint uVar3;
  REF_INTERP ref_interp;
  REF_BOOL *pRVar4;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  REF_LONG nhex;
  REF_LONG npri;
  REF_LONG npyr;
  REF_LONG nqua;
  
  uVar3 = to_grid->node->max;
  uVar9 = (ulong)uVar3;
  ref_interp = (REF_INTERP)malloc(0xb0);
  *ref_interp_ptr = ref_interp;
  if (ref_interp == (REF_INTERP)0x0) {
    pcVar10 = "malloc *ref_interp_ptr of REF_INTERP_STRUCT NULL";
    uVar8 = 0x98;
    goto LAB_0015392e;
  }
  ref_interp->from_grid = from_grid;
  uVar1 = ref_cell_ncell(from_grid->cell[6],from_grid->node,&nqua);
  if (uVar1 == 0) {
    uVar1 = ref_cell_ncell(from_grid->cell[9],from_grid->node,&npyr);
    if (uVar1 == 0) {
      uVar1 = ref_cell_ncell(from_grid->cell[10],from_grid->node,&npri);
      if (uVar1 == 0) {
        uVar1 = ref_cell_ncell(from_grid->cell[0xb],from_grid->node,&nhex);
        if (uVar1 == 0) {
          if ((((nqua < 1) && (npyr < 1)) && (npri < 1)) && (nhex < 1)) {
            ref_interp->from_tet = from_grid->cell[8];
            ref_interp->from_tri = from_grid->cell[3];
            RVar2 = 0;
          }
          else {
            uVar1 = ref_shard_extract_tri(from_grid,&ref_interp->from_tri);
            if (uVar1 != 0) {
              uVar9 = (ulong)uVar1;
              pcVar10 = "shard tri";
              uVar8 = 0xa6;
              goto LAB_001539f2;
            }
            uVar1 = ref_shard_extract_tet(from_grid,&ref_interp->from_tet);
            if (uVar1 != 0) {
              uVar9 = (ulong)uVar1;
              pcVar10 = "shard tet";
              uVar8 = 0xa8;
              goto LAB_001539f2;
            }
            RVar2 = 1;
          }
          ref_interp->from_cell_freeable = RVar2;
          ref_interp->to_grid = to_grid;
          ref_mpi = ref_interp->from_grid->mpi;
          ref_interp->ref_mpi = ref_mpi;
          ref_interp->tree_cells = 0;
          ref_interp->instrument = 0;
          ref_interp->continuously = 0;
          ref_interp->n_walk = 0;
          ref_interp->n_terminated = 0;
          ref_interp->walk_steps = 0;
          ref_interp->n_geom = 0;
          ref_interp->n_geom_fail = 0;
          ref_interp->n_tree = 0;
          ref_interp->max = uVar3;
          if ((int)uVar3 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0xbd,"ref_interp_create","malloc ref_interp->agent_hired of REF_BOOL negative");
            return 1;
          }
          __size = uVar9 * 4;
          pRVar4 = (REF_BOOL *)malloc(__size);
          ref_interp->agent_hired = pRVar4;
          if (pRVar4 == (REF_BOOL *)0x0) {
            pcVar10 = "malloc ref_interp->agent_hired of REF_BOOL NULL";
            uVar8 = 0xbd;
          }
          else {
            for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
              pRVar4[uVar7] = 0;
            }
            pRVar5 = (REF_INT *)malloc(__size);
            ref_interp->cell = pRVar5;
            if (pRVar5 == (REF_INT *)0x0) {
              pcVar10 = "malloc ref_interp->cell of REF_INT NULL";
              uVar8 = 0xbe;
            }
            else {
              for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
                pRVar5[uVar7] = -1;
              }
              pRVar5 = (REF_INT *)malloc(__size);
              ref_interp->part = pRVar5;
              if (pRVar5 == (REF_INT *)0x0) {
                pcVar10 = "malloc ref_interp->part of REF_INT NULL";
                uVar8 = 0xbf;
              }
              else {
                for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
                  pRVar5[uVar7] = -1;
                }
                pRVar6 = (REF_DBL *)malloc((ulong)(uVar3 << 2) << 3);
                ref_interp->bary = pRVar6;
                if (pRVar6 != (REF_DBL *)0x0) {
                  ref_interp->inside = -1e-12;
                  ref_interp->bound = -0.1;
                  uVar3 = ref_agents_create(&ref_interp->ref_agents,ref_mpi);
                  if (uVar3 == 0) {
                    uVar3 = ref_list_create(&ref_interp->visualize);
                    if (uVar3 == 0) {
                      ref_interp->search_fuzz = 1e-12;
                      ref_interp->search_donor_scale = 2.0;
                      uVar3 = ref_interp_create_search(ref_interp);
                      if (uVar3 == 0) {
                        return 0;
                      }
                      uVar9 = (ulong)uVar3;
                      pcVar10 = "fill search";
                      uVar8 = 0xc9;
                    }
                    else {
                      uVar9 = (ulong)uVar3;
                      pcVar10 = "add list";
                      uVar8 = 0xc6;
                    }
                  }
                  else {
                    uVar9 = (ulong)uVar3;
                    pcVar10 = "add agents";
                    uVar8 = 0xc5;
                  }
                  goto LAB_001539f2;
                }
                pcVar10 = "malloc ref_interp->bary of REF_DBL NULL";
                uVar8 = 0xc0;
              }
            }
          }
LAB_0015392e:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar8,"ref_interp_create",pcVar10);
          return 2;
        }
        uVar9 = (ulong)uVar1;
        pcVar10 = "global nhex";
        uVar8 = 0xa3;
      }
      else {
        uVar9 = (ulong)uVar1;
        pcVar10 = "global npri";
        uVar8 = 0xa1;
      }
    }
    else {
      uVar9 = (ulong)uVar1;
      pcVar10 = "global npyr";
      uVar8 = 0x9f;
    }
  }
  else {
    uVar9 = (ulong)uVar1;
    pcVar10 = "global nqua";
    uVar8 = 0x9d;
  }
LAB_001539f2:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar8,
         "ref_interp_create",uVar9,pcVar10);
  return (REF_STATUS)uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_interp_create(REF_INTERP *ref_interp_ptr,
                                     REF_GRID from_grid, REF_GRID to_grid) {
  REF_INTERP ref_interp;
  REF_INT max = ref_node_max(ref_grid_node(to_grid));
  REF_LONG nqua, npyr, npri, nhex;

  ref_malloc(*ref_interp_ptr, 1, REF_INTERP_STRUCT);
  ref_interp = (*ref_interp_ptr);

  ref_interp_from_grid(ref_interp) = from_grid;
  RSS(ref_cell_ncell(ref_grid_qua(from_grid), ref_grid_node(from_grid), &nqua),
      "global nqua");
  RSS(ref_cell_ncell(ref_grid_pyr(from_grid), ref_grid_node(from_grid), &npyr),
      "global npyr");
  RSS(ref_cell_ncell(ref_grid_pri(from_grid), ref_grid_node(from_grid), &npri),
      "global npri");
  RSS(ref_cell_ncell(ref_grid_hex(from_grid), ref_grid_node(from_grid), &nhex),
      "global nhex");
  if (0 < nqua || 0 < npyr || 0 < npri || 0 < nhex) {
    RSS(ref_shard_extract_tri(from_grid, &ref_interp_from_tri(ref_interp)),
        "shard tri");
    RSS(ref_shard_extract_tet(from_grid, &ref_interp_from_tet(ref_interp)),
        "shard tet");
    ref_interp_from_cell_freeable(ref_interp) = REF_TRUE;
  } else {
    ref_interp_from_tet(ref_interp) = ref_grid_tet(from_grid);
    ref_interp_from_tri(ref_interp) = ref_grid_tri(from_grid);
    ref_interp_from_cell_freeable(ref_interp) = REF_FALSE;
  }
  ref_interp_to_grid(ref_interp) = to_grid;

  ref_interp_mpi(ref_interp) = ref_grid_mpi(ref_interp_from_grid(ref_interp));

  ref_interp->instrument = REF_FALSE;
  ref_interp->continuously = REF_FALSE;
  ref_interp->n_walk = 0;
  ref_interp->n_terminated = 0;
  ref_interp->walk_steps = 0;
  ref_interp->n_geom = 0;
  ref_interp->n_geom_fail = 0;
  ref_interp->n_tree = 0;
  ref_interp->tree_cells = 0;
  ref_interp_max(ref_interp) = max;
  ref_malloc_init(ref_interp->agent_hired, max, REF_BOOL, REF_FALSE);
  ref_malloc_init(ref_interp->cell, max, REF_INT, REF_EMPTY);
  ref_malloc_init(ref_interp->part, max, REF_INT, REF_EMPTY);
  ref_malloc(ref_interp->bary, 4 * max, REF_DBL);
  ref_interp->inside = -1.0e-12; /* inside tolerance */
  ref_interp->bound = -0.1;      /* bound tolerance */

  RSS(ref_agents_create(&(ref_interp->ref_agents), ref_interp_mpi(ref_interp)),
      "add agents");
  RSS(ref_list_create(&(ref_interp->visualize)), "add list");
  ref_interp_search_fuzz(ref_interp) = 1.0e-12;
  ref_interp_search_donor_scale(ref_interp) = 2.0;
  RSS(ref_interp_create_search(ref_interp), "fill search");

  return REF_SUCCESS;
}